

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

void ast_error(lgx_ast_t *ast,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  lgx_list_t *local_40;
  lgx_ast_error_list_t *err;
  va_list args;
  char *fmt_local;
  lgx_ast_t *ast_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  local_40 = (lgx_list_t *)calloc(1,0x28);
  if (local_40 != (lgx_list_t *)0x0) {
    local_40->next = local_40;
    local_40->prev = local_40;
    *(undefined4 *)&local_40[1].next = 1;
    iVar1 = lgx_str_init((lgx_str_t *)&local_40[1].prev,0x100);
    if (iVar1 == 0) {
      if ((ast->lex).source.path == (char *)0x0) {
        iVar1 = snprintf((char *)local_40[2].next,(ulong)*(uint *)&local_40[1].prev,
                         "[PARSER ERROR] ");
        *(int *)((long)&local_40[1].prev + 4) = iVar1;
      }
      else {
        iVar1 = snprintf((char *)local_40[2].next,(ulong)*(uint *)&local_40[1].prev,
                         "[PARSER ERROR] [%s:%d:%d] ",(ast->lex).source.path,
                         (ulong)((ast->lex).line + 1),
                         (ulong)(uint)((ast->lex).milestone - (ast->lex).line_start));
        *(int *)((long)&local_40[1].prev + 4) = iVar1;
      }
      args[0].overflow_arg_area = local_f8;
      args[0]._0_8_ = &stack0x00000008;
      err._4_4_ = 0x30;
      err._0_4_ = 0x10;
      iVar1 = vsnprintf((char *)((long)&(local_40[2].next)->next +
                                (ulong)*(uint *)((long)&local_40[1].prev + 4)),
                        (ulong)(0x100 - *(int *)((long)&local_40[1].prev + 4)),fmt,&err);
      *(int *)((long)&local_40[1].prev + 4) = iVar1 + *(int *)((long)&local_40[1].prev + 4);
      lgx_list_add_tail(local_40,&ast->errors);
    }
    else {
      free(local_40);
    }
  }
  return;
}

Assistant:

static void ast_error(lgx_ast_t* ast, const char *fmt, ...) {
    va_list   args;

    lgx_ast_error_list_t* err = xcalloc(1, sizeof(lgx_ast_error_list_t));
    if (!err) {
        return;
    }

    lgx_list_init(&err->head);
    err->err_no = 1;

    if (lgx_str_init(&err->err_msg, 256)) {
        xfree(err);
        return;
    }

    if (ast->lex.source.path) {
        err->err_msg.length = snprintf(err->err_msg.buffer, err->err_msg.size,
            "[PARSER ERROR] [%s:%d:%d] ", ast->lex.source.path, ast->lex.line + 1, ast->lex.milestone - ast->lex.line_start);
    } else {
        err->err_msg.length = snprintf(err->err_msg.buffer, err->err_msg.size,
            "[PARSER ERROR] ");
    }

    va_start(args, fmt);
    err->err_msg.length += vsnprintf(err->err_msg.buffer + err->err_msg.length,
        256 - err->err_msg.length, fmt, args);
    va_end(args);
    
    lgx_list_add_tail(&err->head, &ast->errors);
}